

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

optional<interfaces::BlockRef> * __thiscall
node::anon_unknown_2::MinerImpl::getTip
          (optional<interfaces::BlockRef> *__return_storage_ptr__,MinerImpl *this)

{
  pointer ppCVar1;
  CBlockIndex *this_00;
  ChainstateManager *this_01;
  Chainstate *pCVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  unique_lock<std::recursive_mutex> uStack_58;
  uint256 local_44;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_58,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
             ,0x3a5,false);
  this_01 = chainman(this);
  pCVar2 = ChainstateManager::ActiveChainstate(this_01);
  ppCVar1 = (pCVar2->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((ppCVar1 ==
       (pCVar2->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
       _M_impl.super__Vector_impl_data._M_start) ||
     (this_00 = ppCVar1[-1], this_00 == (CBlockIndex *)0x0)) {
    (__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>)._M_payload.
    super__Optional_payload_base<interfaces::BlockRef>._M_engaged = false;
  }
  else {
    CBlockIndex::GetBlockHash(&local_44,this_00);
    local_24 = this_00->nHeight;
    (__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>)._M_payload.
    super__Optional_payload_base<interfaces::BlockRef>._M_payload._M_value.height = local_24;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>).
             _M_payload.super__Optional_payload_base<interfaces::BlockRef>._M_payload + 0x10) =
         local_44.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>).
             _M_payload.super__Optional_payload_base<interfaces::BlockRef>._M_payload + 0x18) =
         local_44.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>)._M_payload.
      super__Optional_payload_base<interfaces::BlockRef>._M_payload =
         local_44.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>).
             _M_payload.super__Optional_payload_base<interfaces::BlockRef>._M_payload + 8) =
         local_44.super_base_blob<256U>.m_data._M_elems._8_8_;
    (__return_storage_ptr__->super__Optional_base<interfaces::BlockRef,_true,_true>)._M_payload.
    super__Optional_payload_base<interfaces::BlockRef>._M_engaged = true;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<BlockRef> getTip() override
    {
        LOCK(::cs_main);
        CBlockIndex* tip{chainman().ActiveChain().Tip()};
        if (!tip) return {};
        return BlockRef{tip->GetBlockHash(), tip->nHeight};
    }